

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriHelper.cpp
# Opt level: O1

Var Js::UriHelper::Encode
              (JavascriptString *strURI,uchar unescapedFlags,ScriptContext *scriptContext)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  char16 cVar4;
  code *pcVar5;
  ScriptContext *scriptContext_00;
  bool bVar6;
  charcount_t cVar7;
  BOOL BVar8;
  Recycler *this;
  undefined4 *puVar9;
  ulong uVar10;
  uint32 uVar11;
  int32 hCode;
  undefined7 in_register_00000031;
  uint uVar12;
  uint cchUseLength;
  char16 *content;
  char16 *pcVar13;
  bool bVar14;
  undefined1 local_80 [8];
  TrackAllocData data;
  byte local_48 [4];
  undefined4 local_44;
  BYTE bUTF8 [4];
  
  local_44 = (undefined4)CONCAT71(in_register_00000031,unescapedFlags);
  cVar7 = JavascriptString::GetLength(strURI);
  data._32_8_ = JavascriptString::GetString(strURI);
  _bUTF8 = scriptContext;
  if (cVar7 == 0) {
    cchUseLength = 0;
    bVar6 = false;
  }
  else {
    bVar6 = false;
    cchUseLength = 0;
    uVar10 = 0;
    do {
      uVar12 = (uint)uVar10;
      uVar2 = *(ushort *)(data._32_8_ + uVar10 * 2);
      uVar11 = (uint32)uVar2;
      ValidateURIProps();
      if (((ulong)uVar2 < 0x80) && (((&s_uriProps)[uVar2] & (byte)local_44) != 0)) {
        cchUseLength = cchUseLength + 1;
        if (cchUseLength == 0) goto LAB_00d95ea9;
      }
      else {
        if ((uVar2 & 0xfc00) == 0xdc00) {
LAB_00d95e9e:
          hCode = -0x7ff5ec60;
          goto LAB_00d95eb7;
        }
        if (0xfbff < (ushort)(uVar2 + 0x2400)) {
          uVar12 = uVar12 + 1;
          if ((uVar12 == cVar7) ||
             (uVar3 = *(ushort *)(data._32_8_ + (ulong)uVar12 * 2),
             (ushort)(uVar3 + 0x2000) < 0xfc00)) goto LAB_00d95e9e;
          uVar11 = (uint)uVar2 * 0x400 + (uint)uVar3 + 0xfca02400;
        }
        uVar11 = ToUTF8(uVar11,local_48);
        bVar6 = true;
        bVar14 = CARRY4(cchUseLength,uVar11 * 3);
        cchUseLength = cchUseLength + uVar11 * 3;
        if (bVar14) goto LAB_00d95ea9;
      }
      uVar10 = (ulong)(uVar12 + 1);
    } while (uVar12 + 1 < cVar7);
  }
  if (bVar6) {
    if (cchUseLength == 0xffffffff) {
LAB_00d95ea9:
      ::Math::DefaultOverflowPolicy();
    }
    local_80 = (undefined1  [8])&char16_t::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_934b8f8;
    data.filename._0_4_ = 0xbf;
    data.plusSize = (ulong)(cchUseLength + 1);
    this = Memory::Recycler::TrackAllocInfo(_bUTF8->recycler,(TrackAllocData *)local_80);
    if (cchUseLength == 0xffffffff) {
      Memory::Recycler::ClearTrackAllocInfo(this,(TrackAllocData *)0x0);
      content = (char16 *)&DAT_00000008;
    }
    else {
      BVar8 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar8 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar6) goto LAB_00d95ebe;
        *puVar9 = 0;
      }
      content = (char16 *)
                Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                          (this,(ulong)(cchUseLength + 1) * 2);
      if (content == (char16 *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar6) goto LAB_00d95ebe;
        *puVar9 = 0;
      }
    }
    pcVar13 = content;
    if (cVar7 != 0) {
      uVar10 = 0;
      do {
        uVar12 = (uint)uVar10;
        cVar4 = *(char16 *)(data._32_8_ + uVar10 * 2);
        uVar11 = (uint32)(ushort)cVar4;
        ValidateURIProps();
        if (((ulong)(ushort)cVar4 < 0x80) && (((&s_uriProps)[(ushort)cVar4] & (byte)local_44) != 0))
        {
          *pcVar13 = cVar4;
          pcVar13 = pcVar13 + 1;
        }
        else {
          if ((cVar4 & 0xfc00U) == 0xdc00) {
LAB_00d95eae:
            hCode = -0x7ff5ffcd;
LAB_00d95eb7:
            JavascriptError::ThrowURIError(_bUTF8,hCode,(PCWSTR)0x0);
          }
          if (0xfbff < (ushort)(cVar4 + L'␀')) {
            uVar12 = uVar12 + 1;
            if ((uVar12 == cVar7) ||
               (uVar2 = *(ushort *)(data._32_8_ + (ulong)uVar12 * 2),
               (ushort)(uVar2 + 0x2000) < 0xfc00)) goto LAB_00d95eae;
            uVar11 = (uint)(ushort)cVar4 * 0x400 + (uint)uVar2 + 0xfca02400;
          }
          uVar11 = ToUTF8(uVar11,local_48);
          uVar10 = 0;
          do {
            bVar1 = local_48[uVar10];
            *pcVar13 = L'%';
            pcVar13[1] = L"0123456789ABCDEF"[bVar1 >> 4];
            pcVar13[2] = L"0123456789ABCDEF"[bVar1 & 0xf];
            pcVar13 = pcVar13 + 3;
            uVar10 = uVar10 + 1;
          } while (uVar11 != uVar10);
        }
        uVar10 = (ulong)(uVar12 + 1);
      } while (uVar12 + 1 < cVar7);
    }
    scriptContext_00 = _bUTF8;
    if (content + cchUseLength != pcVar13) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/UriHelper.cpp"
                                  ,0xf9,"(outURI + outputLen == outCurrent)",
                                  " URI out buffer out of sync");
      if (!bVar6) {
LAB_00d95ebe:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar9 = 0;
    }
    content[cchUseLength] = L'\0';
    strURI = JavascriptString::NewWithBuffer(content,cchUseLength,scriptContext_00);
  }
  else if ((((((strURI->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
           super_JavascriptLibraryBase).scriptContext.ptr != _bUTF8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/UriHelper.cpp"
                                ,0xb8,"(scriptContext == strURI->GetScriptContext())",
                                "Should have already marshaled the string in cross site thunk");
    if (!bVar6) goto LAB_00d95ebe;
    *puVar9 = 0;
  }
  return strURI;
}

Assistant:

Var UriHelper::Encode(JavascriptString* strURI, unsigned char unescapedFlags, ScriptContext* scriptContext )
    {
        charcount_t len = strURI->GetLength();
        __in_ecount(len) const char16* input = strURI->GetString();
        bool needsChanges = false;
        BYTE bUTF8[MaxUTF8Len];

        // pass 1 calculate output length and error check
        uint32 outputLen = 0;
        for( uint32 k = 0; k < len; k++ )
        {
            char16 c = input[k];
            uint32 uVal;
            if( InURISet(c, unescapedFlags) )
            {
                outputLen = UInt32Math::Add(outputLen, 1);
            }
            else
            {
                needsChanges = true;

                if( c >= 0xDC00 && c <= 0xDFFF )
                {
                    JavascriptError::ThrowURIError(scriptContext, JSERR_URIEncodeError /* TODO-ERROR: _u("NEED MESSAGE") */);
                }
                else if( c < 0xD800 || c > 0xDBFF )
                {
                    uVal = (uint32)c;
                }
                else
                {
                    ++k;
                    if(k == len)
                    {
                        JavascriptError::ThrowURIError(scriptContext, JSERR_URIEncodeError /* TODO-ERROR: _u("NEED MESSAGE") */);
                    }
                    __analysis_assume(k < len); // because we throw exception if k==len
                    char16 c1 = input[k];
                    if( c1 < 0xDC00 || c1 > 0xDFFF )
                    {
                        JavascriptError::ThrowURIError(scriptContext, JSERR_URIEncodeError /* TODO-ERROR: _u("NEED MESSAGE") */);
                    }
                    uVal = (c - 0xD800) * 0x400 + (c1 - 0xDC00) + 0x10000;
                }
                uint32 utfLen = ToUTF8(uVal, bUTF8);
                utfLen = UInt32Math::Mul(utfLen, 3);
                outputLen = UInt32Math::Add(outputLen, utfLen);
            }
        }

        // If nothing needs encoding, then avoid extra work
        if (!needsChanges)
        {
            AssertMsg(scriptContext == strURI->GetScriptContext(), "Should have already marshaled the string in cross site thunk");
            return strURI;
        }

        //pass 2 generate the encoded URI

        uint32 allocSize = UInt32Math::Add(outputLen, 1);
        char16* outURI = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, allocSize);
        char16* outCurrent = outURI;
        const char16 *hexStream = _u("0123456789ABCDEF");

        for( uint32 k = 0; k < len; k++ )
        {
            char16 c = input[k];
            uint32 uVal;
            if( InURISet(c, unescapedFlags) )
            {
                __analysis_assume(outCurrent < outURI + allocSize);
                *outCurrent++ = c;
            }
            else
            {
#if DBG
                if( c >= 0xDC00 && c <= 0xDFFF )
                {
                    JavascriptError::ThrowURIError(scriptContext, VBSERR_InternalError /* TODO-ERROR: _u("NEED MESSAGE") */);
                }
#endif
                if( c < 0xD800 || c > 0xDBFF )
                {
                    uVal = (uint32)c;
                }
                else
                {
                    ++k;
#if DBG
                    if(k == len)
                    {
                        JavascriptError::ThrowURIError(scriptContext, VBSERR_InternalError /* TODO-ERROR: _u("NEED MESSAGE") */);
                    }
#endif
                    __analysis_assume(k < len);// because we throw exception if k==len
                    char16 c1 = input[k];

#if DBG
                    if( c1 < 0xDC00 || c1 > 0xDFFF )
                    {
                        JavascriptError::ThrowURIError(scriptContext, VBSERR_InternalError /* TODO-ERROR: _u("NEED MESSAGE") */);
                    }
#endif
                    uVal = (c - 0xD800) * 0x400 + (c1 - 0xDC00) + 0x10000;
                }

                uint32 utfLen = ToUTF8(uVal, bUTF8);
                for( uint32 j = 0; j < utfLen; j++ )
                {
#pragma prefast(disable: 26014, "buffer length was calculated earlier");
                    BYTE val = bUTF8[j];
                    *outCurrent++ = _u('%');
                    *outCurrent++ = hexStream[(val >> 4)];
                    *outCurrent++ = hexStream[(val & 0xF)];
#pragma prefast(default: 26014);
                }
            }
        }
        AssertMsg(outURI + outputLen == outCurrent, " URI out buffer out of sync");
        __analysis_assume(outputLen + 1 == allocSize);
        outURI[outputLen] = _u('\0');

        return JavascriptString::NewWithBuffer(outURI, outputLen, scriptContext);
    }